

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

Int128 __thiscall ClipperLib::Int128::operator/(Int128 *this,Int128 *rhs)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong *in_RDX;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Int128 IVar14;
  
  uVar1 = *in_RDX;
  uVar7 = in_RDX[1];
  if (uVar7 != 0 || uVar1 != 0) {
    uVar2 = rhs->hi;
    uVar4 = rhs->lo;
    uVar6 = uVar2;
    if ((long)uVar2 < 0) {
      if (uVar4 == 0) {
        uVar4 = 0;
        uVar6 = -uVar2;
      }
      else {
        uVar4 = -uVar4;
        uVar6 = ~uVar2;
      }
    }
    uVar8 = uVar1;
    if ((long)uVar1 < 0) {
      if (uVar7 == 0) {
        uVar7 = 0;
        uVar8 = -uVar1;
      }
      else {
        uVar7 = -uVar7;
        uVar8 = ~uVar1;
      }
    }
    bVar3 = uVar6 < uVar8;
    if (uVar8 == uVar6) {
      bVar3 = (long)uVar4 < (long)uVar7;
    }
    if (bVar3) {
      this->hi = 0;
      this->lo = 0;
    }
    else {
      uVar9 = ~uVar8;
      if (uVar7 == 0) {
        uVar9 = -uVar8;
      }
      iVar10 = 0x80;
      uVar11 = 0;
      uVar8 = 0;
      do {
        uVar11 = uVar11 << 1 | uVar8 >> 0x3f;
        uVar8 = uVar8 << 1 | uVar6 >> 0x3f;
        uVar6 = uVar6 << 1 | uVar4 >> 0x3f;
        uVar12 = uVar8 - uVar7;
        uVar13 = uVar11 + uVar9 + (ulong)(uVar12 < -uVar7);
        if (-1 < (long)uVar13) {
          uVar11 = uVar13;
          uVar8 = uVar12;
        }
        uVar4 = (ulong)(-1 < (long)uVar13) + uVar4 * 2;
        iVar10 = iVar10 + -1;
      } while (iVar10 != 0);
      if ((long)(uVar2 ^ uVar1) < 0) {
        if (uVar4 == 0) {
          uVar6 = -uVar6;
          uVar4 = 0;
        }
        else {
          uVar4 = -uVar4;
          uVar6 = ~uVar6;
        }
      }
      this->hi = uVar6;
      this->lo = uVar4;
    }
    IVar14.lo = uVar7;
    IVar14.hi = (long64)this;
    return IVar14;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Int128 operator/: divide by zero";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

Int128 operator/ (const Int128 &rhs) const
    {
      if (rhs.lo == 0 && rhs.hi == 0)
        throw "Int128 operator/: divide by zero";
      bool negate = (rhs.hi < 0) != (hi < 0);
      Int128 result(*this), denom(rhs);
      if (result.hi < 0) Negate(result);
      if (denom.hi < 0)  Negate(denom);
      if (denom > result) return Int128(0); //result is only a fraction of 1
      Negate(denom);

      Int128 p(0);
      for (int i = 0; i < 128; ++i)
      {
        p.hi = p.hi << 1;
        if (p.lo < 0) p.hi++;
        p.lo = long64(p.lo) << 1;
        if (result.hi < 0) p.lo++;
        result.hi = result.hi << 1;
        if (result.lo < 0) result.hi++;
        result.lo = long64(result.lo) << 1;
        Int128 p2(p);
        p += denom;
        if (p.hi < 0) p = p2;
        else result.lo++;
      }
      if (negate) Negate(result);
      return result;
    }